

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O3

int32_t nghttp2_submit_headers
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,
                  nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,size_t nvlen,
                  void *stream_user_data)

{
  int iVar1;
  int32_t iVar2;
  byte flags_00;
  
  if (stream_id == -1) {
    if (session->server != '\0') {
      return -0x1f9;
    }
  }
  else if (stream_id < 1) {
    return -0x1f5;
  }
  flags_00 = flags & 1;
  if (((pri_spec == (nghttp2_priority_spec *)0x0) ||
      (iVar1 = nghttp2_priority_spec_check_default(pri_spec), iVar1 != 0)) ||
     ((session->remote_settings).no_rfc7540_priorities == 1)) {
    pri_spec = (nghttp2_priority_spec *)0x0;
  }
  else {
    if (stream_id == -1) {
      if (session->next_stream_id == pri_spec->stream_id) {
        return -0x1f5;
      }
    }
    else if (pri_spec->stream_id == stream_id) {
      return -0x1f5;
    }
    flags_00 = flags_00 | 0x20;
  }
  iVar2 = submit_headers_shared_nva
                    (session,flags_00,stream_id,pri_spec,nva,nvlen,(nghttp2_data_provider *)0x0,
                     stream_user_data);
  return iVar2;
}

Assistant:

int32_t nghttp2_submit_headers(nghttp2_session *session, uint8_t flags,
                               int32_t stream_id,
                               const nghttp2_priority_spec *pri_spec,
                               const nghttp2_nv *nva, size_t nvlen,
                               void *stream_user_data) {
  int rv;

  if (stream_id == -1) {
    if (session->server) {
      return NGHTTP2_ERR_PROTO;
    }
  } else if (stream_id <= 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  flags &= NGHTTP2_FLAG_END_STREAM;

  if (pri_spec && !nghttp2_priority_spec_check_default(pri_spec) &&
      session->remote_settings.no_rfc7540_priorities != 1) {
    rv = detect_self_dependency(session, stream_id, pri_spec);
    if (rv != 0) {
      return rv;
    }

    flags |= NGHTTP2_FLAG_PRIORITY;
  } else {
    pri_spec = NULL;
  }

  return submit_headers_shared_nva(session, flags, stream_id, pri_spec, nva,
                                   nvlen, NULL, stream_user_data);
}